

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O2

void TasGrid::IO::writeNumbers<true,(TasGrid::IO::IOPad)4,unsigned_long,unsigned_long>
               (ostream *os,unsigned_long vals,unsigned_long vals_1)

{
  initializer_list<unsigned_long> __l;
  allocator_type local_39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  unsigned_long local_20;
  unsigned_long local_18;
  
  __l._M_len = 2;
  __l._M_array = &local_20;
  local_20 = vals;
  local_18 = vals_1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&values,__l,&local_39);
  writeVector<true,(TasGrid::IO::IOPad)4,unsigned_long>(&values,os);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void writeNumbers(std::ostream &os, Vals... vals){
    std::vector<typename std::tuple_element<0, std::tuple<Vals...>>::type> values = {vals...};
    writeVector<iomode, pad>(values, os);
}